

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_246c54f::ObmcSadTest_RandomValues_Test::TestBody
          (ObmcSadTest_RandomValues_Test *this)

{
  ACMRandom *this_00;
  undefined8 *puVar1;
  ObmcSadTest_RandomValues_Test *pOVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  ulong uVar8;
  SEARCH_METHODS *message;
  int i;
  long lVar9;
  undefined2 in_FPUControlWord;
  undefined2 in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  uint tst_res;
  uint ref_res;
  RegisterStateCheckMMX reg_check_mmx;
  uint8_t pre [16384];
  int32_t mask [16384];
  int32_t wsrc [16384];
  AssertHelper AStack_240a8;
  Message MStack_240a0;
  uint uStack_24098;
  uint uStack_24094;
  ulong uStack_24090;
  internal aiStack_24088 [8];
  undefined2 uStack_24080;
  undefined2 uStack_2407e;
  undefined4 uStack_2407c;
  undefined2 uStack_24078;
  ObmcSadTest_RandomValues_Test *pOStack_24068;
  uchar auStack_24060 [16384];
  uint32_t auStack_20060 [16384];
  int aiStack_10060 [16396];
  
  this_00 = &(this->super_ObmcSadTest).
             super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>
             .rng_;
  uVar8 = 0;
  pOStack_24068 = this;
  while( true ) {
    bVar3 = testing::Test::HasFatalFailure();
    if (bVar3) {
      return;
    }
    uStack_24090 = uVar8;
    uVar4 = testing::internal::Random::Generate(&this_00->random_,0x81);
    lVar9 = 0;
    do {
      uVar5 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      auStack_24060[lVar9] = (uchar)(uVar5 >> 0x17);
      uVar5 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      uVar6 = testing::internal::Random::Generate(&this_00->random_,0x1001);
      aiStack_10060[lVar9] = uVar6 * (uVar5 >> 0x17 & 0xff);
      uVar5 = testing::internal::Random::Generate(&this_00->random_,0x1001);
      pOVar2 = pOStack_24068;
      auStack_20060[lVar9] = uVar5;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x4000);
    uStack_24094 = (*(pOStack_24068->super_ObmcSadTest).
                     super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>
                     .params_.ref_func)(auStack_24060,uVar4,aiStack_10060,(int *)auStack_20060);
    aiStack_24088[0] = SUB21(in_FPUControlWord,0);
    uStack_2407c = (undefined4)in_FPUInstructionPointer;
    uStack_24078 = (undefined2)((ulong)in_FPUInstructionPointer >> 0x20);
    uStack_24080 = in_FPUTagWord;
    uStack_24098 = (*(pOVar2->super_ObmcSadTest).
                     super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>
                     .params_.tst_func)(auStack_24060,uVar4,aiStack_10060,(int *)auStack_20060);
    libaom_test::RegisterStateCheckMMX::Check((RegisterStateCheckMMX *)aiStack_24088);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (aiStack_24088,"ref_res","tst_res",&uStack_24094,&uStack_24098);
    if (aiStack_24088[0] == (internal)0x0) break;
    puVar1 = (undefined8 *)CONCAT44(uStack_2407c,CONCAT22(uStack_2407e,uStack_24080));
    iVar7 = (int)uStack_24090;
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
      iVar7 = (int)uStack_24090;
    }
    uVar8 = (ulong)(iVar7 + 1U);
    if (iVar7 + 1U == 1000) {
      return;
    }
  }
  testing::Message::Message(&MStack_240a0);
  puVar1 = (undefined8 *)CONCAT44(uStack_2407c,CONCAT22(uStack_2407e,uStack_24080));
  if (puVar1 == (undefined8 *)0x0) {
    message = "";
  }
  else {
    message = (SEARCH_METHODS *)*puVar1;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_240a8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/obmc_sad_test.cc"
             ,0x3d,(char *)message);
  testing::internal::AssertHelper::operator=(&AStack_240a8,&MStack_240a0);
  testing::internal::AssertHelper::~AssertHelper(&AStack_240a8);
  if (MStack_240a0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)MStack_240a0.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  puVar1 = (undefined8 *)CONCAT44(uStack_2407c,CONCAT22(uStack_2407e,uStack_24080));
  if (puVar1 == (undefined8 *)0x0) {
    return;
  }
  if ((undefined8 *)*puVar1 != puVar1 + 2) {
    operator_delete((undefined8 *)*puVar1);
  }
  operator_delete(puVar1);
  return;
}

Assistant:

TEST_P(ObmcSadTest, RandomValues) {
  DECLARE_ALIGNED(32, uint8_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  for (int iter = 0; iter < kIterations && !HasFatalFailure(); ++iter) {
    const int pre_stride = rng_(MAX_SB_SIZE + 1);

    for (int i = 0; i < MAX_SB_SQUARE; ++i) {
      pre[i] = rng_.Rand8();
      wsrc[i] = rng_.Rand8() * rng_(kMaskMax * kMaskMax + 1);
      mask[i] = rng_(kMaskMax * kMaskMax + 1);
    }

    const unsigned int ref_res = params_.ref_func(pre, pre_stride, wsrc, mask);
    unsigned int tst_res;
    API_REGISTER_STATE_CHECK(tst_res =
                                 params_.tst_func(pre, pre_stride, wsrc, mask));

    ASSERT_EQ(ref_res, tst_res);
  }
}